

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrADC0x6d(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  ADC(this,argument);
  return 4;
}

Assistant:

int CPU::instrADC0x6d() {
	ADC(absolute_addr());
	return 4;
}